

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void apply_sgr(int sgr_params_idx,uint8_t *dat8,int width,int height,int dat_stride,int use_highbd,
              int bit_depth,int pu_width,int pu_height,int32_t *flt0,int32_t *flt1,int flt_stride,
              aom_internal_error_info *error_info)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  int w;
  int j;
  uint8_t *dat8_row;
  int32_t *flt1_row;
  int32_t *flt0_row;
  int h;
  int i;
  int local_60;
  int local_5c;
  int local_54;
  int local_34;
  
  for (local_34 = 0; local_34 < in_ECX; local_34 = in_stack_00000018 + local_34) {
    if (in_stack_00000018 < in_ECX - local_34) {
      local_5c = in_stack_00000018;
    }
    else {
      local_5c = in_ECX - local_34;
    }
    for (local_54 = 0; local_54 < in_EDX; local_54 = in_stack_00000010 + local_54) {
      if (in_stack_00000010 < in_EDX - local_54) {
        local_60 = in_stack_00000010;
      }
      else {
        local_60 = in_EDX - local_54;
      }
      iVar1 = (*av1_selfguided_restoration)
                        ((uint8_t *)(in_RSI + local_34 * in_R8D + (long)local_54),local_60,local_5c,
                         in_R8D,(int32_t *)
                                (in_stack_00000020 + (long)(local_34 * w) * 4 + (long)local_54 * 4),
                         (int32_t *)
                         (in_stack_00000028 + (long)(local_34 * w) * 4 + (long)local_54 * 4),w,
                         in_EDI,in_stack_00000008,in_R9D);
      if (iVar1 != 0) {
        aom_internal_error((aom_internal_error_info *)dat8_row,AOM_CODEC_MEM_ERROR,
                           "Error allocating buffer in av1_selfguided_restoration");
      }
    }
  }
  return;
}

Assistant:

static inline void apply_sgr(int sgr_params_idx, const uint8_t *dat8, int width,
                             int height, int dat_stride, int use_highbd,
                             int bit_depth, int pu_width, int pu_height,
                             int32_t *flt0, int32_t *flt1, int flt_stride,
                             struct aom_internal_error_info *error_info) {
  for (int i = 0; i < height; i += pu_height) {
    const int h = AOMMIN(pu_height, height - i);
    int32_t *flt0_row = flt0 + i * flt_stride;
    int32_t *flt1_row = flt1 + i * flt_stride;
    const uint8_t *dat8_row = dat8 + i * dat_stride;

    // Iterate over the stripe in blocks of width pu_width
    for (int j = 0; j < width; j += pu_width) {
      const int w = AOMMIN(pu_width, width - j);
      if (av1_selfguided_restoration(
              dat8_row + j, w, h, dat_stride, flt0_row + j, flt1_row + j,
              flt_stride, sgr_params_idx, bit_depth, use_highbd) != 0) {
        aom_internal_error(
            error_info, AOM_CODEC_MEM_ERROR,
            "Error allocating buffer in av1_selfguided_restoration");
      }
    }
  }
}